

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH64_hash_t XXH3_len_4to8_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (uint)seed;
  uVar2 = CONCAT44(*(undefined4 *)input,*(undefined4 *)(input + (len - 4))) ^
          (*(ulong *)(secret + 0x10) ^ *(ulong *)(secret + 8)) -
          ((ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
           << 0x20 ^ seed);
  uVar2 = ((uVar2 << 0x18 | uVar2 >> 0x28) ^ (uVar2 << 0x31 | uVar2 >> 0xf) ^ uVar2) *
          -0x604de39ae16720db;
  uVar2 = ((uVar2 >> 0x23) + len ^ uVar2) * -0x604de39ae16720db;
  return uVar2 >> 0x1c ^ uVar2;
}

Assistant:

XXH_FORCE_INLINE XXH_PUREF XXH64_hash_t
XXH3_len_4to8_64b(const xxh_u8* input, size_t len, const xxh_u8* secret, XXH64_hash_t seed)
{
    XXH_ASSERT(input != NULL);
    XXH_ASSERT(secret != NULL);
    XXH_ASSERT(4 <= len && len <= 8);
    seed ^= (xxh_u64)XXH_swap32((xxh_u32)seed) << 32;
    {   xxh_u32 const input1 = XXH_readLE32(input);
        xxh_u32 const input2 = XXH_readLE32(input + len - 4);
        xxh_u64 const bitflip = (XXH_readLE64(secret+8) ^ XXH_readLE64(secret+16)) - seed;
        xxh_u64 const input64 = input2 + (((xxh_u64)input1) << 32);
        xxh_u64 const keyed = input64 ^ bitflip;
        return XXH3_rrmxmx(keyed, len);
    }
}